

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_io_dp.c
# Opt level: O0

int dynamicPutbuf(gdIOCtx *ctx,void *buf,int size)

{
  dpIOCtx *dctx;
  int size_local;
  void *buf_local;
  gdIOCtx *ctx_local;
  
  appendDynamic((dynamicPtr *)ctx[1].getC,buf,size);
  ctx_local._4_4_ = size;
  if (*(int *)(ctx[1].getC + 0x10) == 0) {
    ctx_local._4_4_ = -1;
  }
  return ctx_local._4_4_;
}

Assistant:

static int dynamicPutbuf(struct gdIOCtx *ctx, const void *buf, int size)
{
	dpIOCtx *dctx;
	dctx = (dpIOCtx *)ctx;

	appendDynamic(dctx->dp, buf, size);

	if(dctx->dp->dataGood) {
		return size;
	} else {
		return -1;
	};
}